

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void ExpandTextArea(CPpmd8 *p)

{
  byte bVar1;
  int iVar2;
  int *local_c8;
  CPpmd8_Node *node_1;
  CPpmd8_Node_Ref *next;
  CPpmd8_Node *node;
  int local_a8;
  uint i;
  UInt32 count [38];
  CPpmd8 *p_local;
  
  count._144_8_ = p;
  memset(&local_a8,0,0x98);
  if (*(long *)(count._144_8_ + 0x40) != *(long *)(count._144_8_ + 0x48)) {
    **(undefined4 **)(count._144_8_ + 0x40) = 0;
  }
  for (next = *(CPpmd8_Node_Ref **)(count._144_8_ + 0x58); *next == 0xffffffff;
      next = next + (ulong)next[2] * 3) {
    *next = 0;
    bVar1 = *(byte *)(count._144_8_ + 0xa6 + (ulong)(next[2] - 1));
    (&local_a8)[bVar1] = (&local_a8)[bVar1] + 1;
  }
  *(CPpmd8_Node_Ref **)(count._144_8_ + 0x58) = next;
  node._4_4_ = 0;
  do {
    if (0x25 < node._4_4_) {
      return;
    }
    node_1 = (CPpmd8_Node *)(count._144_8_ + 0x128 + (ulong)node._4_4_ * 4);
    while ((&local_a8)[node._4_4_] != 0) {
      local_c8 = (int *)(*(long *)(count._144_8_ + 0x38) + (ulong)node_1->Stamp);
      do {
        if (*local_c8 != 0) break;
        node_1->Stamp = local_c8[1];
        local_c8 = (int *)(*(long *)(count._144_8_ + 0x38) + (ulong)node_1->Stamp);
        *(int *)(count._144_8_ + 0x1c0 + (ulong)node._4_4_ * 4) =
             *(int *)(count._144_8_ + 0x1c0 + (ulong)node._4_4_ * 4) + -1;
        iVar2 = (&local_a8)[node._4_4_];
        (&local_a8)[node._4_4_] = iVar2 + -1;
      } while (iVar2 + -1 != 0);
      node_1 = (CPpmd8_Node *)(local_c8 + 1);
    }
    node._4_4_ = node._4_4_ + 1;
  } while( true );
}

Assistant:

static void ExpandTextArea(CPpmd8 *p)
{
  UInt32 count[PPMD_NUM_INDEXES];
  unsigned i;
  memset(count, 0, sizeof(count));
  if (p->LoUnit != p->HiUnit)
    ((CPpmd8_Node *)p->LoUnit)->Stamp = 0;
  
  {
    CPpmd8_Node *node = (CPpmd8_Node *)p->UnitsStart;
    for (; node->Stamp == EMPTY_NODE; node += node->NU)
    {
      node->Stamp = 0;
      count[U2I(node->NU)]++;
    }
    p->UnitsStart = (Byte *)node;
  }
  
  for (i = 0; i < PPMD_NUM_INDEXES; i++)
  {
    CPpmd8_Node_Ref *next = (CPpmd8_Node_Ref *)&p->FreeList[i];
    while (count[i] != 0)
    {
      CPpmd8_Node *node = NODE(*next);
      while (node->Stamp == 0)
      {
        *next = node->Next;
        node = NODE(*next);
        p->Stamps[i]--;
        if (--count[i] == 0)
          break;
      }
      next = &node->Next;
    }
  }
}